

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::float_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,format_specs *specs,
          float_writer<wchar_t> *f)

{
  float_writer<wchar_t> *this_00;
  wchar_t *pwVar1;
  ulong __n;
  wchar_t *pwVar2;
  float_writer<wchar_t> *in_RDX;
  int *in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  checked_ptr<typename_buffer<wchar_t>::value_type> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  wchar_t **in_stack_ffffffffffffff88;
  wchar_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t wVar3;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_48;
  checked_ptr<typename_buffer<wchar_t>::value_type> *local_40;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_38;
  float_writer<wchar_t> *local_30;
  float_writer<wchar_t> *local_28;
  type local_1c;
  float_writer<wchar_t> *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = to_unsigned<int>(*in_RSI);
  this_00 = (float_writer<wchar_t> *)float_writer<wchar_t>::size(local_18);
  local_28 = this_00;
  if (local_1c != 0) {
    this_00 = (float_writer<wchar_t> *)
              float_writer<wchar_t>::width((float_writer<wchar_t> *)0x23c35d);
  }
  local_30 = this_00;
  if (this_00 < (float_writer<wchar_t> *)(ulong)local_1c) {
    local_48 = basic_writer<fmt::v6::buffer_range<wchar_t>_>::reserve
                         ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)this_00,
                          (size_t)in_stack_ffffffffffffff88);
    local_40 = &local_48;
    pwVar1 = fill_t<wchar_t>::operator[]((fill_t<wchar_t> *)(local_10 + 3),0);
    wVar3 = *pwVar1;
    __n = (ulong)local_1c - (long)local_30;
    if ((*(byte *)((long)local_10 + 9) & 0xf) == 2) {
      pwVar1 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         ((wchar_t *)CONCAT44(wVar3,in_stack_ffffffffffffffb0),__n,
                          in_stack_ffffffffffffffa0);
      *local_40 = pwVar1;
      float_writer<wchar_t>::operator()(this_00,in_stack_ffffffffffffff88);
    }
    else if ((*(byte *)((long)local_10 + 9) & 0xf) == 3) {
      pwVar1 = (wchar_t *)(__n >> 1);
      pwVar2 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         ((wchar_t *)CONCAT44(wVar3,in_stack_ffffffffffffffb0),__n,pwVar1);
      *local_40 = pwVar2;
      float_writer<wchar_t>::operator()(this_00,in_stack_ffffffffffffff88);
      pwVar1 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         ((wchar_t *)CONCAT44(wVar3,in_stack_ffffffffffffffb0),__n,pwVar1);
      *local_40 = pwVar1;
    }
    else {
      float_writer<wchar_t>::operator()(this_00,in_stack_ffffffffffffff88);
      pwVar1 = std::fill_n<wchar_t*,unsigned_long,wchar_t>
                         ((wchar_t *)CONCAT44(wVar3,in_stack_ffffffffffffffb0),__n,
                          in_stack_ffffffffffffffa0);
      *local_40 = pwVar1;
    }
  }
  else {
    local_38 = basic_writer<fmt::v6::buffer_range<wchar_t>_>::reserve
                         ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)this_00,(size_t)local_18)
    ;
    float_writer<wchar_t>::operator()(this_00,(wchar_t **)local_18);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }